

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
cmsys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,int *variable,string *value)

{
  char *__nptr;
  long lVar1;
  char *local_28;
  char *res;
  string *value_local;
  int *variable_local;
  CommandLineArguments *this_local;
  
  local_28 = (char *)0x0;
  res = (char *)value;
  value_local = (string *)variable;
  variable_local = (int *)this;
  __nptr = (char *)std::__cxx11::string::c_str();
  lVar1 = strtol(__nptr,&local_28,10);
  *(int *)value_local = (int)lVar1;
  return;
}

Assistant:

void CommandLineArguments::PopulateVariable(
  int* variable, const std::string& value)
{
  char* res = 0;
  *variable = static_cast<int>(strtol(value.c_str(), &res, 10));
  //if ( res && *res )
  //  {
  //  Can handle non-int
  //  }
}